

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O2

FString __thiscall DArgs::TakeValue(DArgs *this,char *check)

{
  char cVar1;
  uint index;
  char *in_RDX;
  TArray<FString,_FString> *this_00;
  
  index = CheckParm((DArgs *)check,in_RDX,1);
  (this->super_DObject)._vptr_DObject = (_func_int **)0x7ff1bc;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if ((0 < (int)index) && ((int)index < *(int *)(check + 0x34))) {
    this_00 = (TArray<FString,_FString> *)(check + 0x28);
    if (index < *(int *)(check + 0x34) - 1U) {
      cVar1 = *this_00->Array[(ulong)index + 1].Chars;
      if ((cVar1 != '+') && (cVar1 != '-')) {
        FString::operator=((FString *)this,this_00->Array + (ulong)index + 1);
        TArray<FString,_FString>::Delete(this_00,index,2);
        return (FString)(char *)this;
      }
    }
    TArray<FString,_FString>::Delete(this_00,index);
  }
  return (FString)(char *)this;
}

Assistant:

FString DArgs::TakeValue(const char *check)
{
	int i = CheckParm(check);
	FString out;

	if (i > 0 && i < (int)Argv.Size())
	{
		if (i < (int)Argv.Size() - 1 && Argv[i+1][0] != '+' && Argv[i+1][0] != '-')
		{
			out = Argv[i+1];
			Argv.Delete(i, 2);	// Delete the parm and its value.
		}
		else
		{
			Argv.Delete(i);		// Just delete the parm, since it has no value.
		}
	}
	return out;
}